

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O0

void skiwi::store_registers(asmcode *code)

{
  operand local_a0 [3];
  operation local_94;
  operand local_90 [3];
  operation local_84;
  operand local_80 [3];
  operation local_74;
  operand local_70 [3];
  operation local_64;
  operand local_60 [3];
  operation local_54;
  operand local_50 [3];
  operation local_44;
  operand local_40 [3];
  operation local_34;
  operand local_30 [3];
  operation local_24;
  operand local_20 [3];
  operation local_14;
  asmcode *local_10;
  asmcode *code_local;
  
  local_14 = MOV;
  local_20[2] = 0x23;
  local_20[1] = 0;
  local_20[0] = RBX;
  local_10 = code;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_14,local_20 + 2,(int *)(local_20 + 1),local_20);
  local_24 = MOV;
  local_30[2] = 0x23;
  local_30[1] = 8;
  local_30[0] = RDI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_24,local_30 + 2,(int *)(local_30 + 1),local_30);
  local_34 = MOV;
  local_40[2] = 0x23;
  local_40[1] = 0x10;
  local_40[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_44 = MOV;
  local_50[2] = 0x23;
  local_50[1] = 0x18;
  local_50[0] = RSP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_44,local_50 + 2,(int *)(local_50 + 1),local_50);
  local_54 = MOV;
  local_60[2] = 0x23;
  local_60[1] = 0x20;
  local_60[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_54,local_60 + 2,(int *)(local_60 + 1),local_60);
  local_64 = MOV;
  local_70[2] = 0x23;
  local_70[1] = 0x28;
  local_70[0] = R12;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_64,local_70 + 2,(int *)(local_70 + 1),local_70);
  local_74 = MOV;
  local_80[2] = 0x23;
  local_80[1] = 0x30;
  local_80[0] = R13;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_74,local_80 + 2,(int *)(local_80 + 1),local_80);
  local_84 = MOV;
  local_90[2] = 0x23;
  local_90[1] = 0x38;
  local_90[0] = R14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_84,local_90 + 2,(int *)(local_90 + 1),local_90);
  local_94 = MOV;
  local_a0[2] = 0x23;
  local_a0[1] = 0x40;
  local_a0[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_94,local_a0 + 2,(int *)(local_a0 + 1),local_a0);
  return;
}

Assistant:

void store_registers(asmcode& code)
  {
  /*
  linux: r12, r13, r14, r15, rbx, rsp, rbp should be preserved
  windows: r12, r13, r14, r15, rbx, rsp, rbp, rdi, rsi
  */
  code.add(asmcode::MOV, RBX_STORE, asmcode::RBX);
  code.add(asmcode::MOV, RDI_STORE, asmcode::RDI);
  code.add(asmcode::MOV, RSI_STORE, asmcode::RSI);
  code.add(asmcode::MOV, RSP_STORE, asmcode::RSP);
  code.add(asmcode::MOV, RBP_STORE, asmcode::RBP);
  code.add(asmcode::MOV, R12_STORE, asmcode::R12);
  code.add(asmcode::MOV, R13_STORE, asmcode::R13);
  code.add(asmcode::MOV, R14_STORE, asmcode::R14);
  code.add(asmcode::MOV, R15_STORE, asmcode::R15);
  }